

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cmp.cpp
# Opt level: O3

bool __thiscall CmdCmp::Execute(CmdCmp *this)

{
  uint uVar1;
  _List_node_base *p_Var2;
  char cVar3;
  FileType FVar4;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  _Self __tmp;
  bool bVar9;
  char *pcVar10;
  int iVar11;
  string *p;
  char t2;
  char t1;
  string fileName2;
  string fileName1;
  ifstream file2;
  ifstream file1;
  char local_483;
  char local_482 [2];
  string local_480;
  string local_460;
  long local_440 [4];
  uint auStack_420 [122];
  long local_238 [4];
  uint auStack_218 [122];
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cmp: invalid option -- \'",0x18);
    p_Var2 = (this->super_Command).option.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var2[1]._M_next,(long)p_Var2[1]._M_prev);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar10 = "Try \'cmp -- help\' for more information.";
    lVar7 = 0x27;
LAB_00108db8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    return false;
  }
  if ((this->super_Command).parameter.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size < 2) {
    pcVar10 = "error";
    lVar7 = 5;
    goto LAB_00108db8;
  }
  local_460._M_string_length = 0;
  local_460.field_2._M_local_buf[0] = '\0';
  local_480._M_string_length = 0;
  local_480.field_2._M_local_buf[0] = '\0';
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_assign((string *)&local_460);
  std::__cxx11::string::_M_assign((string *)&local_480);
  p = &local_460;
  FVar4 = DirUtils::GetFileType(p);
  if (FVar4 == DU_DIRECTORY) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cmp: ",5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_460._M_dataplus._M_p,local_460._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Is a directory",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    FVar4 = DirUtils::GetFileType(&local_480);
    if (FVar4 != DU_DIRECTORY) {
      std::ifstream::ifstream(local_238,local_460._M_dataplus._M_p,_S_bin);
      std::ifstream::ifstream(local_440,local_480._M_dataplus._M_p,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cmp: ",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_460._M_dataplus._M_p,
                            local_460._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,": No such file or directory",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
LAB_00109108:
        bVar9 = false;
      }
      else {
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cmp: ",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_480._M_dataplus._M_p,
                              local_480._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,": No such file or directory",0x1b);
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_00109108;
        }
        bVar9 = true;
        if ((*(byte *)((long)auStack_218 + *(long *)(local_238[0] + -0x18)) & 2) == 0) {
          uVar5 = *(uint *)((long)auStack_420 + *(long *)(local_440[0] + -0x18));
          iVar11 = 1;
          iVar8 = 1;
          do {
            if ((uVar5 & 2) != 0) break;
            std::istream::read((char *)local_238,(long)local_482);
            std::istream::read((char *)local_440,(long)&local_483);
            uVar1 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
            if ((uVar1 & 5) != 0) {
              if ((*(byte *)((long)auStack_420 + *(long *)(local_440[0] + -0x18)) & 5) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"cmp: EOF on ",0xc);
LAB_00109186:
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
LAB_00109250:
                std::endl<char,std::char_traits<char>>(poVar6);
                goto LAB_00109108;
              }
              break;
            }
            uVar5 = *(uint *)((long)auStack_420 + *(long *)(local_440[0] + -0x18));
            if ((uVar5 & 5) != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"cmp: EOF on ",0xc);
              p = &local_480;
              goto LAB_00109186;
            }
            if (local_482[0] != local_483) {
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_460._M_dataplus._M_p,
                                  local_460._M_string_length);
              local_482[1] = 0x20;
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_482 + 1,1);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,local_480._M_dataplus._M_p,local_480._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," differ: ",9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"byte ",5);
              poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"line ",5);
              poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
              goto LAB_00109250;
            }
            iVar8 = iVar8 + (uint)(local_482[0] == '\n');
            iVar11 = iVar11 + 1;
          } while ((uVar1 & 2) == 0);
        }
      }
      std::ifstream::~ifstream(local_440);
      std::ifstream::~ifstream(local_238);
      goto LAB_00109121;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cmp: ",5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_480._M_dataplus._M_p,local_480._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Is a directory",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  bVar9 = false;
LAB_00109121:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p == &local_460.field_2) {
    return bVar9;
  }
  operator_delete(local_460._M_dataplus._M_p);
  return bVar9;
}

Assistant:

bool CmdCmp::Execute(){
	if(option.size() != 0){	
		cout << "cmp: invalid option -- '" << option.front() << "'" << endl;
		cout << "Try 'cmp -- help' for more information." << endl;
		return false;
	}
	if(parameter.size() < 2){
		cout << "error" << endl;
		return false;
	}
	auto i = parameter.begin();
	string fileName1, fileName2;
	fileName1 = (*i);
	i++;
	fileName2 = (*i);

	if(GetFileType(fileName1) == DU_DIRECTORY){
		cout << "cmp: " << fileName1 << ": Is a directory" << endl;
		return false;
	}
	if(GetFileType(fileName2) == DU_DIRECTORY){
		cout << "cmp: " << fileName2 << ": Is a directory" << endl;
		return false;
	}
	/* input file */
	ifstream file1(fileName1.c_str(), ios::binary),
		file2(fileName2.c_str(), ios::binary);
	if(!file1.is_open()){
		cout << "cmp: " << fileName1 << ": No such file or directory" << endl;
		return false;
	}
	if(!file2.is_open()){
		cout << "cmp: " << fileName2 << ": No such file or directory" << endl;
		return false;
	}
	/* comparing */
	char t1, t2;
	int cntLine = 1, cntByte = 0;

	while(!file1.eof() && !file2.eof()){
		cntByte++;
		file1.read(&t1, sizeof(t1));
		file2.read(&t2, sizeof(t2));
		if(file1.fail() && file2.fail())return true;
		if(file1.fail()){
			cout << "cmp: EOF on " << fileName1 << endl;
			return false;
		}
		if(file2.fail()){
			cout << "cmp: EOF on " << fileName2 << endl;
			return false;
		}
		if(t1 != t2){
			cout << fileName1 << ' ' << fileName2 << " differ: ";
			cout << "byte " << cntByte << ", ";
			cout << "line " << cntLine << endl;
			return 0;
		}
		if(t1 == '\n')cntLine++;
	}

	return true;
}